

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,uint32_t *elements,uint32_t num_elements,
          bool specialized)

{
  uint32_t i;
  ulong uVar1;
  TypedID<(diligent_spirv_cross::Types)3> local_34;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_00899d40;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  ConstantMatrix::ConstantMatrix(&this->m);
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  this->is_null_array_specialized_length = false;
  (this->subconstants).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.buffer_size = 0;
  (this->subconstants).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::reserve
            (&this->subconstants,(ulong)num_elements);
  for (uVar1 = 0; num_elements != uVar1; uVar1 = uVar1 + 1) {
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::push_back
              (&this->subconstants,&local_34);
  }
  this->specialization = specialized;
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, const uint32_t *elements, uint32_t num_elements, bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		subconstants.reserve(num_elements);
		for (uint32_t i = 0; i < num_elements; i++)
			subconstants.push_back(elements[i]);
		specialization = specialized;
	}